

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::Closest(Element *this,String *selectors)

{
  pointer *this_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  reference ppSVar4;
  StyleSheetNode *node;
  iterator __end2;
  iterator __begin2;
  StyleSheetNodeListRaw *__range2;
  Element *parent;
  String local_168;
  undefined1 local_138 [8];
  StyleSheetNodeListRaw leaf_nodes;
  StyleSheetNode root_node;
  String *selectors_local;
  Element *this_local;
  
  this_00 = &leaf_nodes.
             super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  StyleSheetNode::StyleSheetNode((StyleSheetNode *)this_00);
  StyleSheetParser::ConstructNodes
            ((StyleSheetNodeListRaw *)local_138,(StyleSheetNode *)this_00,selectors);
  bVar1 = ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::empty
                    ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                     local_138);
  if (bVar1) {
    uVar2 = ::std::__cxx11::string::c_str();
    GetAddress_abi_cxx11_(&local_168,this,false,true);
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",uVar2,uVar3);
    ::std::__cxx11::string::~string((string *)&local_168);
    this_local = (Element *)0x0;
  }
  else {
    for (__range2 = (StyleSheetNodeListRaw *)GetParentNode(this);
        __range2 != (StyleSheetNodeListRaw *)0x0;
        __range2 = (StyleSheetNodeListRaw *)GetParentNode((Element *)__range2)) {
      __end2 = ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::begin
                         ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                          local_138);
      node = (StyleSheetNode *)
             ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::end
                       ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)
                        local_138);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<Rml::StyleSheetNode_**,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
                                    *)&node);
        if (!bVar1) break;
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<Rml::StyleSheetNode_**,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
                  ::operator*(&__end2);
        bVar1 = StyleSheetNode::IsApplicable(*ppSVar4,(Element *)__range2,this);
        if (bVar1) {
          this_local = (Element *)__range2;
          goto LAB_0054ec00;
        }
        __gnu_cxx::
        __normal_iterator<Rml::StyleSheetNode_**,_std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>_>
        ::operator++(&__end2);
      }
    }
    this_local = (Element *)0x0;
  }
LAB_0054ec00:
  ::std::vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~vector
            ((vector<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_> *)local_138);
  StyleSheetNode::~StyleSheetNode
            ((StyleSheetNode *)
             &leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local;
}

Assistant:

Element* Element::Closest(const String& selectors) const
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return nullptr;
	}

	Element* parent = GetParentNode();

	while (parent)
	{
		for (const StyleSheetNode* node : leaf_nodes)
		{
			if (node->IsApplicable(parent, this))
			{
				return parent;
			}
		}

		parent = parent->GetParentNode();
	}

	return nullptr;
}